

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O3

void prod_histo(qnode_ptr_t f,char *c_fn,char *h_fn,int nbin,float incr,float *ttl_err,
               float *ttl_std,float *dens)

{
  disp_field512_t *padVar1;
  ulong uVar2;
  int iVar3;
  qnode_ptr_t ptVar4;
  long lVar5;
  long lVar6;
  FILE *__stream;
  param512_t *papVar7;
  int extraout_EDX;
  ulong uVar8;
  int *piVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  char *pcVar13;
  qnode_ptr_t q;
  int iVar14;
  qnode_ptr_t p;
  int iVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  float fVar22;
  undefined4 in_XMM0_Db;
  float fVar23;
  float fVar24;
  histo_t c_histo1 [100];
  histo_t histo1 [100];
  int iStack_abc;
  float fStack_a54;
  float fStack_a50;
  int iStack_a4c;
  ulong uStack_a48;
  qnode_ptr_t ptStack_a40;
  ulong uStack_a38;
  qnode_ptr_t ptStack_a30;
  ulong uStack_a28;
  code *pcStack_a20;
  float local_a18;
  undefined4 uStack_a14;
  double local_a10;
  ulong local_a08;
  undefined8 local_a00;
  disp_field512_t *local_9f8;
  int local_9ec;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  float *local_9d0;
  float *local_9c8;
  long local_9c0;
  float *local_9b8;
  ulong local_9b0;
  float local_9a4;
  qnode_ptr_t local_9a0;
  float local_998 [2];
  int local_990 [298];
  float local_4e8 [2];
  int local_4e0 [300];
  
  uVar8 = (ulong)(uint)nbin;
  local_9d0 = dens;
  pcStack_a20 = (code *)0x1051d5;
  local_a18 = incr;
  uStack_a14 = in_XMM0_Db;
  local_9a0 = (qnode_ptr_t)h_fn;
  ptVar4 = (qnode_ptr_t)malloc(0x170);
  local_9e8._0_4_ = (float)f->res;
  local_9e8._4_4_ = f->sizx;
  uStack_9e0._0_4_ = f->sizy;
  uStack_9e0._4_4_ = f->sizz;
  ptVar4->res = (int)(float)local_9e8;
  ptVar4->sizx = local_9e8._4_4_;
  ptVar4->sizy = (undefined4)uStack_9e0;
  ptVar4->sizz = uStack_9e0._4_4_;
  ptVar4->ofst = 0;
  ptVar4->level = 0;
  pcStack_a20 = (code *)0x1051f7;
  local_9f8 = (disp_field512_t *)malloc(0xc3080);
  ptVar4->flow_ptr = local_9f8;
  pcStack_a20 = (code *)0x10520e;
  load_velocity(ptVar4,c_fn);
  local_a10 = (double)CONCAT44(local_a10._4_4_,(float)nbin);
  uVar12 = 0;
  pcStack_a20 = (code *)0x105231;
  memset(local_4e8,0,0x4b0);
  pcStack_a20 = (code *)0x105245;
  memset(local_998,0,0x4b0);
  local_9a4 = (float)(double)CONCAT44(uStack_a14,local_a18);
  fVar23 = local_a10._0_4_ * local_9a4;
  *ttl_err = 0.0;
  *ttl_std = 0.0;
  iVar3 = f->sizy;
  iVar15 = KERNEL_Y;
  local_a18 = fVar23;
  local_a08 = uVar8;
  local_9c8 = ttl_err;
  local_9b8 = ttl_std;
  if (KERNEL_Y + 9 < (iVar3 - KERNEL_Y) + -9) {
    local_9c0 = CONCAT44(local_9c0._4_4_,nbin + -1);
    ptVar4 = (qnode_ptr_t)((long)KERNEL_Y + 9);
    local_9ec = (int)(float)local_9e8;
    local_a00 = (long)(int)(float)local_9e8;
    iVar14 = f->sizx;
    fVar24 = 0.0;
    iVar20 = 0;
    iVar11 = KERNEL_X;
    do {
      if (iVar11 + 9 < (iVar14 - iVar11) + -9) {
        local_9b0 = (long)ptVar4 * local_a00;
        uVar8 = (long)iVar11 + 9;
        do {
          lVar5 = (long)f->res * (long)ptVar4;
          padVar1 = f->flow_ptr;
          fVar22 = padVar1[-1][lVar5 + uVar8 + 0x18610].x;
          if (((fVar22 != -100.0) || (NAN(fVar22))) &&
             ((fVar22 = padVar1[-1][lVar5 + uVar8 + 0x18610].y, fVar22 != 100.0 || (NAN(fVar22)))))
          {
            uVar16 = (uint)(((*f->param_ptr[f->sizz / 2])[lVar5 + uVar8].mag / fVar23) *
                           local_a10._0_4_);
            local_9e8 = CONCAT44(local_9e8._4_4_,fVar24);
            pcStack_a20 = (code *)0x10538e;
            fVar22 = psi_error(padVar1[-1][lVar5 + uVar8 + 0x18610],
                               local_9f8[-1][local_9b0 + uVar8 + 0x18610]);
            fVar24 = (float)local_9e8 + fVar22;
            iVar20 = iVar20 + 1;
            if ((int)local_a08 <= (int)uVar16) {
              uVar16 = (uint)local_9c0;
            }
            lVar5 = (long)(int)uVar16;
            local_4e8[lVar5 * 3 + 1] = local_4e8[lVar5 * 3 + 1] + fVar22;
            local_4e0[lVar5 * 3] = local_4e0[lVar5 * 3] + 1;
            fVar23 = local_a18;
            if (-1 < (int)uVar16) {
              lVar5 = 0;
              do {
                *(float *)((long)local_998 + lVar5 + 4) =
                     *(float *)((long)local_998 + lVar5 + 4) + fVar22;
                *(int *)((long)local_990 + lVar5) = *(int *)((long)local_990 + lVar5) + 1;
                lVar5 = lVar5 + 0xc;
              } while ((ulong)uVar16 * 0xc + 0xc != lVar5);
            }
          }
          uVar12 = (ulong)((int)uVar12 + 1);
          uVar8 = uVar8 + 1;
          iVar14 = f->sizx;
        } while ((long)uVar8 < (long)((iVar14 - KERNEL_X) + -9));
        iVar3 = f->sizy;
        iVar15 = KERNEL_Y;
        iVar11 = KERNEL_X;
      }
      ptVar4 = (qnode_ptr_t)((long)&ptVar4->res + 1);
    } while ((long)ptVar4 < (long)((iVar3 - iVar15) + -9));
    local_a00 = CONCAT44(local_a00._4_4_,(float)iVar20);
    iVar14 = local_9ec;
    if ((int)uVar12 == 0) {
      fVar22 = 0.0;
    }
    else {
      fVar22 = (float)iVar20 / (float)(int)uVar12;
    }
  }
  else {
    fVar22 = 0.0;
    local_a00 = (ulong)local_a00._4_4_ << 0x20;
    fVar24 = 0.0;
    iVar14 = (int)(float)local_9e8;
  }
  uVar18 = local_a08 & 0xffffffff;
  *local_9d0 = fVar22;
  *local_9c8 = fVar24 / (float)local_a00;
  if (0 < (int)local_a08) {
    lVar5 = 0;
    do {
      if (*(int *)((long)local_4e0 + lVar5) != 0) {
        *(float *)((long)local_4e8 + lVar5 + 4) =
             *(float *)((long)local_4e8 + lVar5 + 4) / (float)*(int *)((long)local_4e0 + lVar5);
      }
      if (*(int *)((long)local_990 + lVar5) != 0) {
        *(float *)((long)local_998 + lVar5 + 4) =
             *(float *)((long)local_998 + lVar5 + 4) / (float)*(int *)((long)local_990 + lVar5);
      }
      lVar5 = lVar5 + 0xc;
    } while (uVar18 * 0xc != lVar5);
  }
  if (iVar15 + 9 < (iVar3 - iVar15) + -9) {
    uVar16 = (int)local_a08 - 1;
    uVar8 = (ulong)uVar16;
    ptVar4 = (qnode_ptr_t)(long)(iVar15 + 9);
    local_9c0 = (long)iVar14;
    iVar14 = f->sizx;
    local_9e8 = CONCAT44(local_9e8._4_4_,fVar24 / (float)local_a00);
    iVar11 = KERNEL_X;
    local_9b0 = uVar18;
    do {
      if (iVar11 + 9 < (iVar14 - iVar11) + -9) {
        lVar5 = (long)ptVar4 * local_9c0;
        lVar21 = (long)iVar11 + 9;
        do {
          lVar6 = (long)f->res * (long)ptVar4 + lVar21;
          padVar1 = f->flow_ptr;
          fVar22 = (*padVar1)[lVar6].x;
          if (((fVar22 != -100.0) || (NAN(fVar22))) &&
             ((fVar22 = (*padVar1)[lVar6].y, fVar22 != 100.0 || (NAN(fVar22))))) {
            uVar10 = (uint)(((*f->param_ptr[f->sizz / 2])[lVar6].mag / fVar23) * local_a10._0_4_);
            pcStack_a20 = (code *)0x105608;
            fVar22 = psi_error((*padVar1)[lVar6],(*local_9f8)[lVar21 + lVar5]);
            *local_9b8 = *local_9b8 + ((float)local_9e8 - fVar22) * ((float)local_9e8 - fVar22);
            if ((int)local_a08 <= (int)uVar10) {
              uVar10 = uVar16;
            }
            uVar12 = (ulong)uVar10;
            lVar6 = (long)(int)uVar10;
            local_4e8[lVar6 * 3] =
                 local_4e8[lVar6 * 3] +
                 (local_4e8[lVar6 * 3 + 1] - fVar22) * (local_4e8[lVar6 * 3 + 1] - fVar22);
            fVar23 = local_a18;
            if (-1 < (int)uVar10) {
              lVar6 = 0;
              do {
                fVar24 = *(float *)((long)local_998 + lVar6 + 4) - fVar22;
                *(float *)((long)local_998 + lVar6) =
                     *(float *)((long)local_998 + lVar6) + fVar24 * fVar24;
                lVar6 = lVar6 + 0xc;
              } while (uVar12 * 0xc + 0xc != lVar6);
            }
          }
          lVar21 = lVar21 + 1;
          iVar14 = f->sizx;
        } while (lVar21 < (iVar14 - KERNEL_X) + -9);
        iVar3 = f->sizy;
        uVar18 = local_9b0;
        iVar15 = KERNEL_Y;
        iVar11 = KERNEL_X;
      }
      ptVar4 = (qnode_ptr_t)((long)&ptVar4->res + 1);
    } while ((long)ptVar4 < (long)((iVar3 - iVar15) + -9));
  }
  fVar23 = *local_9b8 / (float)local_a00;
  if (fVar23 < 0.0) {
    pcStack_a20 = (code *)0x10573f;
    fVar23 = sqrtf(fVar23);
  }
  else {
    fVar23 = SQRT(fVar23);
  }
  uVar2 = local_a08;
  *local_9b8 = fVar23;
  iVar3 = (int)local_a08;
  if (0 < iVar3) {
    uVar8 = uVar18 * 0xc;
    ptVar4 = (qnode_ptr_t)0x0;
    do {
      if (*(int *)((long)local_4e0 + (long)ptVar4) != 0) {
        fVar23 = *(float *)((long)local_4e8 + (long)ptVar4) /
                 (float)*(int *)((long)local_4e0 + (long)ptVar4);
        if (fVar23 < 0.0) {
          pcStack_a20 = (code *)0x105799;
          fVar23 = sqrtf(fVar23);
        }
        else {
          fVar23 = SQRT(fVar23);
        }
        *(float *)((long)local_4e8 + (long)ptVar4) = fVar23;
      }
      if (*(int *)((long)local_990 + (long)ptVar4) != 0) {
        fVar23 = *(float *)((long)local_998 + (long)ptVar4) /
                 (float)*(int *)((long)local_990 + (long)ptVar4);
        if (fVar23 < 0.0) {
          pcStack_a20 = (code *)0x1057d7;
          fVar23 = sqrtf(fVar23);
        }
        else {
          fVar23 = SQRT(fVar23);
        }
        *(float *)((long)local_998 + (long)ptVar4) = fVar23;
      }
      ptVar4 = (qnode_ptr_t)((long)ptVar4 + 0xc);
    } while ((qnode_ptr_t)uVar8 != ptVar4);
  }
  pcVar13 = "w";
  pcStack_a20 = (code *)0x105802;
  p = local_9a0;
  __stream = fopen((char *)local_9a0,"w");
  if (__stream == (FILE *)0x0) {
    pcStack_a20 = write_velocity;
    prod_histo_cold_1();
    uStack_a28 = uVar2;
    q = (qnode_ptr_t)0x180;
    uStack_a48 = uVar8;
    ptStack_a40 = f;
    uStack_a38 = uVar18;
    ptStack_a30 = ptVar4;
    pcStack_a20 = (code *)uVar12;
    iVar3 = creat((char *)p,0x180);
    if (iVar3 < 1) {
      write_velocity_cold_1();
      ptVar4 = (qnode_ptr_t)(ulong)(uint)q->sizy;
      iVar3 = q->ofst;
      iVar15 = q->sizy - iVar3;
      if (iVar3 < iVar15) {
        iVar14 = q->sizx;
        iVar11 = iVar3;
        do {
          if (iVar3 < iVar14 - iVar3) {
            uVar8 = (ulong)(uint)q->sizz;
            iVar15 = iVar3;
            do {
              if (0 < (int)uVar8) {
                lVar5 = 0;
                do {
                  fVar23 = dx(p,q,iVar11,iVar15,(int)lVar5);
                  (*q->param_ptr[lVar5])[q->res * iVar11 + iVar15].fx = fVar23;
                  fVar23 = dy(p,q,iVar11,iVar15,(int)lVar5);
                  (*q->param_ptr[lVar5])[q->res * iVar11 + iVar15].fy = fVar23;
                  lVar5 = lVar5 + 1;
                  uVar8 = (ulong)q->sizz;
                } while (lVar5 < (long)uVar8);
                iVar14 = q->sizx;
                iVar3 = q->ofst;
              }
              iVar15 = iVar15 + 1;
            } while (iVar15 < iVar14 - iVar3);
            ptVar4 = (qnode_ptr_t)(ulong)(uint)q->sizy;
          }
          iVar11 = iVar11 + 1;
          iVar15 = (int)ptVar4 - iVar3;
        } while (iVar11 < iVar15);
      }
      iVar14 = (int)ptVar4;
      iVar11 = p->sizz / 2;
      if (iVar3 < iVar15) {
        iVar20 = q->sizx;
        iStack_abc = iVar3;
        do {
          if (iVar3 < iVar20 - iVar3) {
            piVar9 = &(*q->param_ptr[iVar11])[(long)iStack_abc * (long)q->res + (long)iVar3].err;
            iVar19 = iVar20 + iVar3 * -2;
            iVar17 = iVar3;
            do {
              if (*piVar9 == 0) {
                fVar23 = dt(p,ptVar4,iStack_abc,iVar17);
                piVar9[-4] = (int)fVar23;
              }
              iVar17 = iVar17 + 1;
              piVar9 = piVar9 + 8;
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
          }
          iStack_abc = iStack_abc + 1;
        } while (iStack_abc != iVar15);
      }
      iVar15 = iVar14 - iVar3;
      if ((extraout_EDX == 0) && (iVar3 < iVar15)) {
        iVar20 = q->sizx;
        iVar17 = iVar3;
        do {
          if (iVar3 < iVar20 - iVar3) {
            papVar7 = q->param_ptr[iVar11];
            iVar15 = q->res;
            lVar5 = (long)iVar3;
            do {
              if ((*papVar7)[iVar17 * iVar15 + lVar5].err == 0) {
                iVar3 = (int)lVar5;
                fVar23 = dxx(q,iVar17,iVar3,iVar11);
                (*q->param_ptr[iVar11])[(long)q->res * (long)iVar17 + lVar5].fxx = fVar23;
                fVar23 = dyy(q,iVar17,iVar3,iVar11);
                (*q->param_ptr[iVar11])[(long)q->res * (long)iVar17 + lVar5].fyy = fVar23;
                fVar23 = dxy(q,iVar17,iVar3,iVar11);
                papVar7 = q->param_ptr[iVar11];
                iVar15 = q->res;
                (*papVar7)[iVar17 * iVar15 + lVar5].fxy = fVar23;
                iVar20 = q->sizx;
                iVar3 = q->ofst;
              }
              lVar5 = lVar5 + 1;
            } while ((int)lVar5 < iVar20 - iVar3);
            iVar14 = q->sizy;
          }
          iVar17 = iVar17 + 1;
          iVar15 = iVar14 - iVar3;
        } while (iVar17 < iVar15);
      }
      if (iVar3 < iVar15) {
        lVar21 = (long)iVar3;
        lVar5 = q->sizx - lVar21;
        iVar14 = iVar3;
        do {
          if (iVar3 < (int)lVar5) {
            piVar9 = &(*q->param_ptr[iVar11])[(long)iVar14 * (long)q->res + lVar21].err;
            lVar6 = lVar21;
            do {
              if (*piVar9 == 0) {
                fVar23 = (float)*(undefined8 *)(piVar9 + -3);
                fVar22 = (float)((ulong)*(undefined8 *)(piVar9 + -3) >> 0x20);
                piVar9[-1] = (int)SQRT(fVar22 * fVar22 + fVar23 * fVar23);
              }
              lVar6 = lVar6 + 1;
              piVar9 = piVar9 + 8;
            } while (lVar6 < lVar5);
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 != iVar15);
      }
      return;
    }
    fStack_a50 = (float)*(int *)((long)pcVar13 + 4);
    fStack_a54 = (float)*(int *)((long)pcVar13 + 8);
    write(iVar3,&fStack_a50,4);
    write(iVar3,&fStack_a54,4);
    fStack_a50 = (float)(*(int *)((long)pcVar13 + 4) + KERNEL_X * -2 + -0x12);
    fStack_a54 = (float)(*(int *)((long)pcVar13 + 8) + KERNEL_Y * -2 + -0x12);
    write(iVar3,&fStack_a50,4);
    write(iVar3,&fStack_a54,4);
    fStack_a50 = (float)(KERNEL_X + 9);
    fStack_a54 = (float)(KERNEL_Y + 9);
    write(iVar3,&fStack_a50,4);
    write(iVar3,&fStack_a54,4);
    iVar15 = KERNEL_Y + 9;
    iVar14 = *(int *)((long)pcVar13 + 8);
    if (iVar15 < (iVar14 - KERNEL_Y) + -9) {
      iVar11 = *(int *)((long)pcVar13 + 4);
      iVar20 = KERNEL_Y;
      iVar17 = KERNEL_X;
      do {
        if (iVar17 + 9 < (iVar11 - iVar17) + -9) {
          lVar5 = (long)iVar17 + 9;
          iStack_a4c = iVar15;
          do {
            lVar21 = (long)*(int *)pcVar13 * (long)iVar15 + lVar5;
            fStack_a50 = *(float *)(*(long *)((long)pcVar13 + 0x158) + 4 + lVar21 * 8);
            fStack_a54 = -*(float *)(*(long *)((long)pcVar13 + 0x158) + lVar21 * 8);
            write(iVar3,&fStack_a50,4);
            write(iVar3,&fStack_a54,4);
            lVar5 = lVar5 + 1;
            iVar11 = *(int *)((long)pcVar13 + 4);
          } while ((int)lVar5 < (iVar11 - KERNEL_X) + -9);
          iVar14 = *(int *)((long)pcVar13 + 8);
          iVar20 = KERNEL_Y;
          iVar17 = KERNEL_X;
          iVar15 = iStack_a4c;
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 < (iVar14 - iVar20) + -9);
    }
    close(iVar3);
    return;
  }
  local_9e8 = CONCAT44(local_9e8._4_4_,(float)local_990[0]);
  pcStack_a20 = (code *)0x105836;
  fprintf(__stream,"%2d\n",2);
  pcStack_a20 = (code *)0x10584a;
  fprintf(__stream,"%3d\n",uVar2 & 0xffffffff);
  local_9f8 = (disp_field512_t *)((double)local_9a4 * -0.5 + (double)local_a18);
  pcStack_a20 = (code *)0x10587e;
  fprintf(__stream,"%5.7f\n");
  if (iVar3 < 1) {
    pcStack_a20 = (code *)0x1059dc;
    fwrite("\n\n\n",3,1,__stream);
    pcStack_a20 = (code *)0x1059f0;
    fprintf(__stream,"%3d\n",uVar2 & 0xffffffff);
    pcStack_a20 = (code *)0x105a07;
    fprintf(__stream,"%5.7f\n",local_9f8);
  }
  else {
    local_a18 = local_a18 / local_a10._0_4_;
    local_a10 = (double)local_a18 * 0.5;
    piVar9 = local_4e0;
    uVar8 = 0;
    do {
      pcStack_a20 = (code *)0x105900;
      fprintf(__stream,"%5.7f %10.7f %10.7f %3.7f\n",
              (double)((float)(int)uVar8 * local_a18) + local_a10,(double)(float)piVar9[-1],
              (double)(float)piVar9[-2],(double)((float)*piVar9 / (float)local_9e8));
      uVar8 = uVar8 + 1;
      piVar9 = piVar9 + 3;
    } while (uVar18 != uVar8);
    pcStack_a20 = (code *)0x105925;
    fwrite("\n\n\n",3,1,__stream);
    pcStack_a20 = (code *)0x105939;
    fprintf(__stream,"%3d\n",uVar18 & 0xffffffff);
    pcStack_a20 = (code *)0x105950;
    fprintf(__stream,"%5.7f\n",local_9f8);
    if (0 < (int)local_a08) {
      piVar9 = local_990;
      uVar8 = 0;
      do {
        pcStack_a20 = (code *)0x1059b5;
        fprintf(__stream,"%5.7f %10.7f %10.7f %3.7f\n",
                (double)((float)(int)uVar8 * local_a18) + local_a10,(double)(float)piVar9[-1],
                (double)(float)piVar9[-2],(double)((float)*piVar9 / (float)local_9e8));
        uVar8 = uVar8 + 1;
        piVar9 = piVar9 + 3;
      } while (uVar18 != uVar8);
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void prod_histo(f,c_fn,h_fn,nbin,incr,ttl_err,ttl_std,dens)
qnode_ptr_t f ;
string c_fn, h_fn ;
float incr, *ttl_err, *ttl_std, *dens ;
int nbin ;

{ qnode_ptr_t create_node(), q ;
  disp_vect_t u ;
  histo_t histo1[N_BINS], c_histo1[N_BINS] ;
  float psi_error(), max_mag, mag, err, avg_err, density, t, x, y ;
  int fdf, nbytes, i, j, k, index1, ttl_freq, abs_freq ;
  FILE *fdp ;
  extern int KERNEL_X, KERNEL_Y ;

  q = create_node(0,f->res,f->sizx,f->sizy,f->sizz,0) ;
  q->flow_ptr = (disp_field512_t *)malloc(sizeof(disp_field512_t)) ;
  load_velocity(q,c_fn) ;

  max_mag = incr*(float)nbin ;
  for (i = 0 ; i < N_BINS ; i++) {
    histo1[i].avg = 0.0 ;
    histo1[i].std = 0.0 ;
    histo1[i].freq = 0 ;
    c_histo1[i].avg = 0.0 ;
    c_histo1[i].std = 0.0 ;
    c_histo1[i].freq = 0 ;
  }
  abs_freq = 0 ;
  ttl_freq = 0 ;
  avg_err = 0.0 ;
  *ttl_err = 0.0 ;
  *ttl_std = 0.0 ;

  for (i = KERNEL_Y + NRADIUS ; i < f->sizy - KERNEL_Y - NRADIUS ; i++) {
    for (j = KERNEL_X + NRADIUS ; j < f->sizx -  KERNEL_X - NRADIUS ; j++) {
      mag = (*f->param_ptr[f->sizz/2])[f->res*i + j].mag ;
      index1 = (int)((mag/max_mag)*(float)nbin) ;
      u = (*f->flow_ptr)[f->res*i+j] ;
      abs_freq++ ;
      if (u.x != -100.0 && u.y != 100.0) {
        err = psi_error((*f->flow_ptr)[f->res*i+j],(*q->flow_ptr)[q->res*i+j]) ;
        avg_err += err ;
        ttl_freq++ ;
        if (index1 >= nbin) {
          index1 = nbin - 1 ;
        }
        histo1[index1].avg += err ;
        histo1[index1].freq++ ;
        for (k = 0 ; k <= index1 ; k++) {
          c_histo1[k].avg += err ;
          c_histo1[k].freq++ ;
        }
      }
    }
  }
  if (abs_freq != 0) {
    *dens = (float)ttl_freq/(float)abs_freq ;
  }
  else {
    *dens = 0.0 ;
  }
  *ttl_err = avg_err/(float)ttl_freq ;
  avg_err = *ttl_err ;
  for (i = 0 ; i < nbin ; i++) {
    if (histo1[i].freq != 0) {
      histo1[i].avg /= (float)histo1[i].freq ;
    }
    if (c_histo1[i].freq != 0) {
      c_histo1[i].avg /= (float)c_histo1[i].freq ;
    }
  }
  for (i = KERNEL_Y + NRADIUS ; i < f->sizy - KERNEL_Y - NRADIUS ; i++) {
    for (j = KERNEL_X + NRADIUS ; j < f->sizx - KERNEL_X - NRADIUS ; j++) {
      mag = (*f->param_ptr[f->sizz/2])[f->res*i + j].mag ;
      index1 = (int)((mag/max_mag)*(float)nbin) ;
      u = (*f->flow_ptr)[f->res*i+j] ;
      if (u.x != -100.0 && u.y != 100.0) {
        err = psi_error((*f->flow_ptr)[f->res*i+j],(*q->flow_ptr)[q->res*i+j]) ;
        *ttl_std += pow(avg_err - err,2.0) ;
        if (index1 >= nbin) {
          index1 = nbin - 1 ;
        }
        histo1[index1].std += pow(histo1[index1].avg - err,2.0) ;
        for (k = 0 ; k <= index1 ; k++) {
          c_histo1[k].std += pow(c_histo1[k].avg - err,2.0) ;
        }
      }
    }
  }
  *ttl_std = sqrt(*ttl_std/(float)ttl_freq) ;
  for (i = 0 ; i < nbin ; i++) {
    if (histo1[i].freq != 0) {
      histo1[i].std = sqrt(histo1[i].std/(float)histo1[i].freq) ;
    }
    if (c_histo1[i].freq != 0) {
      c_histo1[i].std = sqrt(c_histo1[i].std/(float)c_histo1[i].freq) ;
    }
  }
  if ((fdp = fopen(h_fn,"w")) == NULL) {
    error(7) ;
  }

  density = c_histo1[0].freq ;
  fprintf(fdp,"%2d\n",N_HISTO) ;
  fprintf(fdp,"%3d\n",nbin) ;
  fprintf(fdp,"%5.7f\n",max_mag - incr/2.0) ;
  for (i = 0 ; i < nbin ; i++) {
    t = max_mag/(float)nbin ;
    fprintf(fdp,"%5.7f %10.7f %10.7f %3.7f\n", t*(float)(i)+t/2.0,
    histo1[i].avg, histo1[i].std, (float)histo1[i].freq/density) ;
  }
  fprintf(fdp,"\n\n\n") ;

  fprintf(fdp,"%3d\n",nbin) ;
  fprintf(fdp,"%5.7f\n",max_mag - incr/2.0) ;
  for (i = 0 ; i < nbin ; i++) {
    t = max_mag/(float)nbin ;
    fprintf(fdp,"%5.7f %10.7f %10.7f %3.7f\n", t*(float)(i)+t/2.0,
    c_histo1[i].avg, c_histo1[i].std, (float)c_histo1[i].freq/density) ;
  }
  fclose(fdp) ;
}